

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O2

int run_test_tcp_close(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_130;
  sockaddr_in addr;
  sockaddr_in local_110;
  uv_tcp_t tcp_server;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_110);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_init(puVar2,&tcp_server);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&local_110,0);
        if (iVar1 == 0) {
          iVar1 = uv_listen((uv_stream_t *)&tcp_server,0x80,connection_cb);
          if (iVar1 == 0) {
            uv_unref((uv_handle_t *)&tcp_server);
            iVar1 = uv_tcp_init(puVar2,&tcp_handle);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,(sockaddr *)&addr,connect_cb);
              if (iVar1 == 0) {
                if (write_cb_called == 0) {
                  if (close_cb_called == 0) {
                    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                    if (iVar1 == 0) {
                      printf("%d of %d write reqs seen\n",(ulong)(uint)write_cb_called,0x20);
                      if (write_cb_called == 0x20) {
                        if (close_cb_called == 1) {
                          puVar2 = uv_default_loop();
                          uv_walk(puVar2,close_walk_cb,(void *)0x0);
                          uv_run(puVar2,UV_RUN_DEFAULT);
                          puVar2 = uv_default_loop();
                          iVar1 = uv_loop_close(puVar2);
                          if (iVar1 == 0) {
                            return 0;
                          }
                          pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                          uStack_130 = 0x86;
                        }
                        else {
                          pcVar3 = "close_cb_called == 1";
                          uStack_130 = 0x84;
                        }
                      }
                      else {
                        pcVar3 = "write_cb_called == NUM_WRITE_REQS";
                        uStack_130 = 0x83;
                      }
                    }
                    else {
                      pcVar3 = "r == 0";
                      uStack_130 = 0x7f;
                    }
                  }
                  else {
                    pcVar3 = "close_cb_called == 0";
                    uStack_130 = 0x7c;
                  }
                }
                else {
                  pcVar3 = "write_cb_called == 0";
                  uStack_130 = 0x7b;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_130 = 0x79;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_130 = 0x73;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_130 = 0x5c;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_130 = 0x59;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_130 = 0x56;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
      uStack_130 = 0x53;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_130 = 0x6b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close.c"
          ,uStack_130,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(tcp_close) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &tcp_handle);
  ASSERT(r == 0);

  r = uv_tcp_connect(&connect_req,
                     &tcp_handle,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  printf("%d of %d write reqs seen\n", write_cb_called, NUM_WRITE_REQS);

  ASSERT(write_cb_called == NUM_WRITE_REQS);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}